

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::HDivDirectionsMaster
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *directions)

{
  double *pdVar1;
  double local_f8;
  TPZFNMatrix<9,_double> gradx;
  
  local_f8 = 0.0;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&gradx,3,1,&local_f8);
  pdVar1 = TPZFMatrix<double>::operator()(&gradx.super_TPZFMatrix<double>,0,0);
  *pdVar1 = 1.0;
  pztopology::TPZLine::ComputeHDivDirections<double>(&gradx.super_TPZFMatrix<double>,directions);
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&gradx);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirectionsMaster(TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.);
    for (int i = 0; i < TGeo::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TGeo::ComputeHDivDirections(gradx, directions);
}